

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

Array<unsigned_char> *
kj::anon_unknown_64::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  bool bVar1;
  uint64_t uVar2;
  WiderType<Decay<const_unsigned_long_&>,_Decay<unsigned_long_&>_> size;
  uchar *puVar3;
  size_t sVar4;
  size_t sVar5;
  ulong __n;
  Array<unsigned_char> *pAVar6;
  Vector<kj::Array<unsigned_char>_> *pVVar7;
  Fault local_c0;
  Fault f_1;
  Array<unsigned_char> *p;
  Array<unsigned_char> *__end4;
  Array<unsigned_char> *__begin4;
  Vector<kj::Array<unsigned_char>_> *__range4;
  byte *pos;
  size_t n;
  Array<unsigned_char> part;
  Fault local_58;
  Fault f;
  size_t BLOCK_SIZE;
  Vector<kj::Array<unsigned_char>_> parts;
  uint64_t uStack_20;
  bool nulTerminate_local;
  uint64_t limit_local;
  InputStream *input_local;
  Array<unsigned_char> *result;
  
  parts.builder.disposer._7_1_ = nulTerminate;
  uStack_20 = limit;
  limit_local = (uint64_t)input;
  input_local = (InputStream *)__return_storage_ptr__;
  Vector<kj::Array<unsigned_char>_>::Vector((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
  f.exception = (Exception *)0x1000;
  do {
    if (uStack_20 == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x4e,FAILED,"limit > 0","\"Reached limit before EOF.\"",
                 (char (*) [26])"Reached limit before EOF.");
      _::Debug::Fault::fatal(&local_58);
    }
    size = min<unsigned_long_const&,unsigned_long&>((unsigned_long *)&f,&stack0xffffffffffffffe0);
    heapArray<unsigned_char>((Array<unsigned_char> *)&n,size);
    uVar2 = limit_local;
    puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)&n);
    sVar4 = Array<unsigned_char>::size((Array<unsigned_char> *)&n);
    sVar5 = Array<unsigned_char>::size((Array<unsigned_char> *)&n);
    __n = (**(code **)(*(long *)uVar2 + 0x10))(uVar2,puVar3,sVar4,sVar5);
    uStack_20 = uStack_20 - __n;
    sVar4 = Array<unsigned_char>::size((Array<unsigned_char> *)&n);
    if (__n < sVar4) {
      sVar4 = Vector<kj::Array<unsigned_char>_>::size
                        ((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      heapArray<unsigned_char>
                (__return_storage_ptr__,
                 sVar4 * 0x1000 + __n + (ulong)(parts.builder.disposer._7_1_ & 1));
      __range4 = (Vector<kj::Array<unsigned_char>_> *)
                 Array<unsigned_char>::begin(__return_storage_ptr__);
      __end4 = Vector<kj::Array<unsigned_char>_>::begin
                         ((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      pAVar6 = Vector<kj::Array<unsigned_char>_>::end
                         ((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      for (; __end4 != pAVar6; __end4 = __end4 + 1) {
        f_1.exception = (Exception *)__end4;
        puVar3 = Array<unsigned_char>::begin(__end4);
        memcpy(__range4,puVar3,0x1000);
        __range4 = __range4 + 0x80;
      }
      puVar3 = Array<unsigned_char>::begin((Array<unsigned_char> *)&n);
      memcpy(__range4,puVar3,__n);
      pVVar7 = (Vector<kj::Array<unsigned_char>_> *)((long)&(__range4->builder).ptr + __n);
      __range4 = pVVar7;
      if ((parts.builder.disposer._7_1_ & 1) != 0) {
        __range4 = (Vector<kj::Array<unsigned_char>_> *)((long)&(pVVar7->builder).ptr + 1);
        *(undefined1 *)&(pVVar7->builder).ptr = 0;
      }
      pVVar7 = (Vector<kj::Array<unsigned_char>_> *)
               Array<unsigned_char>::end(__return_storage_ptr__);
      if (__range4 != pVVar7) {
        _::Debug::Fault::Fault
                  (&local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                   ,0x5c,FAILED,"pos == result.end()","");
        _::Debug::Fault::fatal(&local_c0);
      }
      bVar1 = true;
    }
    else {
      pAVar6 = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&n);
      Vector<kj::Array<unsigned_char>>::add<kj::Array<unsigned_char>>
                ((Vector<kj::Array<unsigned_char>> *)&BLOCK_SIZE,pAVar6);
      bVar1 = false;
    }
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&n);
    if (bVar1) {
      Vector<kj::Array<unsigned_char>_>::~Vector((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part.begin(), part.size(), part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}